

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmain.c
# Opt level: O1

ebml_element * EBML_FindNextId(stream *Input,ebml_context *Context,size_t MaxDataSize)

{
  char cVar1;
  filepos_t fVar2;
  long lVar3;
  filepos_t fVar4;
  ebml_element *p;
  uint uVar5;
  uint8_t *puVar6;
  int in_R9D;
  char IdLength;
  byte *pbVar7;
  ulong uVar8;
  int iVar9;
  uint8_t PossibleId [4];
  size_t _SizeLength;
  filepos_t SizeUnknown;
  uint8_t PossibleSize [8];
  byte local_7c [4];
  stream *local_78;
  size_t local_70;
  long local_68;
  filepos_t local_60;
  size_t local_58;
  ebml_context *local_50;
  filepos_t local_48;
  filepos_t local_40;
  uint8_t local_38 [8];
  
  local_60 = 8;
  local_70 = 0;
  if (Input == (stream *)0x0) {
    __assert_fail("(const void*)(Input)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                  ,0x13d,
                  "ebml_element *EBML_FindNextId(struct stream *, const ebml_context *, size_t)");
  }
  uVar8 = 0;
  IdLength = '\0';
  local_68 = 0;
  fVar4 = 0;
  local_58 = MaxDataSize;
  local_50 = Context;
  do {
    fVar2 = (**(code **)((long)(Input->Base).VMT + 0x78))(Input,0,1);
    lVar3 = (**(code **)((long)(Input->Base).VMT + 0x60))(Input,local_7c + IdLength,1,0);
    if (lVar3 == 0) {
      pbVar7 = local_7c + (char)(IdLength + '\x01');
      uVar5 = 0x80;
      iVar9 = 1;
      local_78 = Input;
      local_48 = fVar2;
      local_40 = fVar4;
      do {
        cVar1 = IdLength;
        if ((iVar9 == cVar1) || ('\x04' < (char)(cVar1 + '\x01'))) goto LAB_00110c29;
        if ((uVar5 & local_7c[0]) != 0) {
          local_68 = 1;
          break;
        }
        uVar5 = uVar5 >> 1;
        lVar3 = (**(code **)((long)(local_78->Base).VMT + 0x60))(local_78,pbVar7,1,0);
        pbVar7 = pbVar7 + 1;
        iVar9 = iVar9 + 1;
        IdLength = cVar1 + '\x01';
      } while (lVar3 == 0);
      IdLength = cVar1 + '\x01';
      fVar2 = local_48;
      Input = local_78;
      fVar4 = local_40;
    }
    local_78 = (stream *)(**(code **)((long)(Input->Base).VMT + 0x78))(Input,0,1);
    cVar1 = (char)uVar8;
    uVar8 = uVar8 & 0xff;
    do {
      cVar1 = cVar1 + '\x01';
      if (7 < uVar8) goto LAB_00110c29;
      puVar6 = local_38 + uVar8;
      uVar8 = uVar8 + 1;
      lVar3 = (**(code **)((long)(Input->Base).VMT + 0x60))(Input,puVar6,1,0);
    } while ((lVar3 == 0) &&
            (local_70 = uVar8, fVar4 = EBML_ReadCodedSizeValue(local_38,&local_70,&local_60),
            local_70 == 0));
  } while (local_68 == 0);
  p = CreateElement(Input,local_7c,IdLength,local_50,(ebml_master *)0xffffffff,in_R9D);
  if (p == (ebml_element *)0x0) {
    __assert_fail("Result != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                  ,0x162,
                  "ebml_element *EBML_FindNextId(struct stream *, const ebml_context *, size_t)");
  }
  p->SizeLength = cVar1;
  p->DataSize = fVar4;
  lVar3 = (**(code **)((long)(p->Base).Base.VMT + 0x70))(p);
  if ((lVar3 == 0) || ((fVar4 != local_60 && (local_58 < (ulong)p->DataSize)))) {
    NodeDelete((node *)p);
LAB_00110c29:
    p = (ebml_element *)0x0;
  }
  else {
    p->ElementPosition = fVar2;
    p->SizePosition = (filepos_t)local_78;
    p->EndPosition = (filepos_t)(local_78->URL + local_70 + fVar4 + -0x20);
  }
  return p;
}

Assistant:

ebml_element *EBML_FindNextId(struct stream *Input, const ebml_context *Context, size_t MaxDataSize)
{
    filepos_t aElementPosition, aSizePosition;
    filepos_t SizeFound=0, SizeUnknown=8;
    int ReadSize;
    uint8_t BitMask;
    uint8_t PossibleId[4];
    uint8_t PossibleSize[8]; // we don't support size stored in more than 64 bits
    bool_t bElementFound = 0;
    int8_t PossibleID_Length = 0;
    size_t _SizeLength=0;
    uint8_t PossibleSizeLength = 0;
    ebml_element *Result = NULL;

    while (!bElementFound)
    {
        aElementPosition = Stream_Seek(Input,0,SEEK_CUR);
        ReadSize = 0;
        BitMask = 1 << 7;
        for (;;)
        {
            if (Stream_ReadOneOrMore(Input,&PossibleId[PossibleID_Length], 1, NULL)!=ERR_NONE)
                break;
            ReadSize++;
            if (ReadSize == PossibleID_Length)
                return NULL; // No more data ?
            if (++PossibleID_Length > 4)
                return NULL; // we don't support element IDs over class D
            if (PossibleId[0] & BitMask)
            {
                bElementFound = 1;
                break;
            }
            BitMask >>= 1;
        }

        // read the data size
        aSizePosition = Stream_Seek(Input,0,SEEK_CUR);
        do {
            if (PossibleSizeLength >= 8)
                // Size is larger than 8 bytes
                return NULL;

            if (Stream_ReadOneOrMore(Input,&PossibleSize[PossibleSizeLength++], 1, NULL)!=ERR_NONE)
                break;
            ReadSize++;
            _SizeLength = PossibleSizeLength;
            SizeFound = EBML_ReadCodedSizeValue(&PossibleSize[0], &_SizeLength, &SizeUnknown);
        } while (_SizeLength == 0);
    }

    // look for the ID in the provided context
    Result = CreateElement(Input, PossibleId, PossibleID_Length, Context,NULL, EBML_ANY_PROFILE);
    assert(Result != NULL);
#if 0
if (PossibleID_Length==4)
printf("Elt: size %d id %d %02X%02X%02X%02X\n",SizeFound,PossibleID_Length,PossibleId[0],PossibleId[1],PossibleId[2],PossibleId[3]);
else if (PossibleID_Length==3)
printf("Elt: size %d id %d %02X%02X%02X\n",SizeFound,PossibleID_Length,PossibleId[0],PossibleId[1],PossibleId[2]);
else if (PossibleID_Length==2)
printf("Elt: size %d id %d %02X%02X\n",SizeFound,PossibleID_Length,PossibleId[0],PossibleId[1]);
else if (PossibleID_Length==1)
printf("Elt: size %d id %d %02X\n",SizeFound,PossibleID_Length,PossibleId[0]);
#endif
    Result->SizeLength = PossibleSizeLength;
    Result->DataSize = SizeFound;
    if (!EBML_ElementValidateSize(Result) || (SizeFound != SizeUnknown && MaxDataSize < (size_t)Result->DataSize))
    {
        NodeDelete((node*)Result);
        return NULL;
    }
    Result->ElementPosition = aElementPosition;
    Result->SizePosition = aSizePosition;
    Result->EndPosition = aSizePosition + _SizeLength + SizeFound;

    return Result;
}